

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O1

double esum(int *mu,double *x)

{
  int iVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = *x;
  iVar1 = *mu;
  if (dVar2 <= 0.0) {
    if ((iVar1 < 0) || (dVar2 = dVar2 + (double)iVar1, 0.0 < dVar2)) goto LAB_0010741c;
  }
  else if ((0 < iVar1) || (dVar2 = dVar2 + (double)iVar1, dVar2 < 0.0)) {
LAB_0010741c:
    dVar2 = exp((double)*mu);
    dVar3 = exp(*x);
    return dVar3 * dVar2;
  }
  dVar2 = exp(dVar2);
  return dVar2;
}

Assistant:

double esum(int *mu,double *x)
/*
-----------------------------------------------------------------------
                    EVALUATION OF EXP(MU + X)
-----------------------------------------------------------------------
*/
{
static double esum,w;
/*
     ..
     .. Executable Statements ..
*/
    if(*x > 0.0e0) goto S10;
    if(*mu < 0) goto S20;
    w = (double)*mu+*x;
    if(w > 0.0e0) goto S20;
    esum = exp(w);
    return esum;
S10:
    if(*mu > 0) goto S20;
    w = (double)*mu+*x;
    if(w < 0.0e0) goto S20;
    esum = exp(w);
    return esum;
S20:
    w = *mu;
    esum = exp(w)*exp(*x);
    return esum;
}